

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

MDString * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
          (LLVMContext *this,Module **u,
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_1)

{
  Module *module;
  MDString *this_00;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> bStack_48;
  
  this_00 = (MDString *)allocate(this,0x30,8);
  if (this_00 != (MDString *)0x0) {
    module = *u;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&bStack_48,u_1);
    MDString::MDString(this_00,module,&bStack_48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&bStack_48);
    append_typed_destructor<LLVMBC::MDString>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}